

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

void __thiscall
SGParser::Parse<SGParser::Generator::RegExprDFAParseElement>::Destroy
          (Parse<SGParser::Generator::RegExprDFAParseElement> *this)

{
  RegExprDFAParseElement *pRVar1;
  unsigned_long *puVar2;
  void *local_20;
  void *local_18;
  Parse<SGParser::Generator::RegExprDFAParseElement> *local_10;
  Parse<SGParser::Generator::RegExprDFAParseElement> *this_local;
  
  local_10 = this;
  CleanupParseStack(this,0);
  local_18 = (void *)0x0;
  pRVar1 = std::exchange<SGParser::Generator::RegExprDFAParseElement*,decltype(nullptr)>
                     (&this->pStack,&local_18);
  if (pRVar1 != (RegExprDFAParseElement *)0x0) {
    operator_delete__(pRVar1);
  }
  local_20 = (void *)0x0;
  puVar2 = std::exchange<unsigned_long*,decltype(nullptr)>
                     (&this->pValidTokenStackPositions,&local_20);
  if (puVar2 != (unsigned_long *)0x0) {
    operator_delete__(puVar2);
  }
  this->TopState = 0xffffffff;
  return;
}

Assistant:

void Parse<StackElement>::Destroy() {
    // Delete the parse stack
    CleanupParseStack();

    delete[] std::exchange(pStack, nullptr);
    delete[] std::exchange(pValidTokenStackPositions, nullptr);

    TopState = InvalidState;
}